

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteCollectionCacheRemoveRecord(unqlite_col *pCol,jx9_int64 nId)

{
  unqlite_col_record *puVar1;
  sxu32 iBucket;
  unqlite_col_record *pRecord;
  jx9_int64 nId_local;
  unqlite_col *pCol_local;
  
  puVar1 = CollectionCacheFetchRecord(pCol,nId);
  if (puVar1 == (unqlite_col_record *)0x0) {
    pCol_local._4_4_ = -6;
  }
  else {
    if (puVar1->pPrevCol == (unqlite_col_record *)0x0) {
      pCol->apRecord[(uint)nId & pCol->nRecSize - 1] = puVar1->pNextCol;
    }
    else {
      puVar1->pPrevCol->pNextCol = puVar1->pNextCol;
    }
    if (puVar1->pNextCol != (unqlite_col_record *)0x0) {
      puVar1->pNextCol->pPrevCol = puVar1->pPrevCol;
    }
    if (pCol->pList == puVar1) {
      pCol->pList = pCol->pList->pNext;
    }
    if (puVar1->pPrev != (unqlite_col_record *)0x0) {
      puVar1->pPrev->pNext = puVar1->pNext;
    }
    if (puVar1->pNext != (unqlite_col_record *)0x0) {
      puVar1->pNext->pPrev = puVar1->pPrev;
    }
    pCol->nRec = pCol->nRec - 1;
    pCol_local._4_4_ = 0;
  }
  return pCol_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionCacheRemoveRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId      /* Unique record ID */
	)
{
	unqlite_col_record *pRecord;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord == 0 ){
		/* No such record */
		return UNQLITE_NOTFOUND;
	}
	if( pRecord->pPrevCol ){
		pRecord->pPrevCol->pNextCol = pRecord->pNextCol;
	}else{
		sxu32 iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
		pCol->apRecord[iBucket] = pRecord->pNextCol;
	}
	if( pRecord->pNextCol ){
		pRecord->pNextCol->pPrevCol = pRecord->pPrevCol;
	}
	/* Unlink */
	MACRO_LD_REMOVE(pCol->pList,pRecord);
	pCol->nRec--;
	return UNQLITE_OK;
}